

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

void Mpm_ObjAddChoiceCutsToStore(Mpm_Man_t *p,Mig_Obj_t *pRoot,Mig_Obj_t *pObj,int ReqTime)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int fCompl;
  int ArrTime;
  int hNext;
  int hCut;
  Mpm_Cut_t *pCut;
  int ReqTime_local;
  Mig_Obj_t *pObj_local;
  Mig_Obj_t *pRoot_local;
  Mpm_Man_t *p_local;
  
  uVar2 = Mig_ObjPhase(pRoot);
  uVar3 = Mig_ObjPhase(pObj);
  ArrTime = Mpm_ObjCutList(p,pObj);
  while( true ) {
    bVar1 = false;
    if (ArrTime != 0) {
      _hNext = Mpm_CutFetch(p,ArrTime);
      bVar1 = false;
      if (_hNext != (Mpm_Cut_t *)0x0) {
        fCompl = _hNext->hNext;
        bVar1 = true;
      }
    }
    if (!bVar1) break;
    iVar4 = Abc_Lit2Var(_hNext->pLeaves[0]);
    iVar5 = Mig_ObjId(pObj);
    if ((iVar4 != iVar5) && (iVar4 = Mpm_CutGetArrTime(p,_hNext), iVar4 <= ReqTime)) {
      *(uint *)&_hNext->field_0x4 =
           *(uint *)&_hNext->field_0x4 & 0xfdffffff |
           ((*(uint *)&_hNext->field_0x4 >> 0x19 & 1 ^ uVar2 ^ uVar3) & 1) << 0x19;
      _hNext = Mpm_ManMergeCuts(p,_hNext,(Mpm_Cut_t *)0x0,(Mpm_Cut_t *)0x0);
      Mpm_ObjAddCutToStore(p,_hNext,iVar4);
    }
    ArrTime = fCompl;
  }
  return;
}

Assistant:

void Mpm_ObjAddChoiceCutsToStore( Mpm_Man_t * p, Mig_Obj_t * pRoot, Mig_Obj_t * pObj, int ReqTime )
{
    Mpm_Cut_t * pCut;
    int hCut, hNext, ArrTime;
    int fCompl = Mig_ObjPhase(pRoot) ^ Mig_ObjPhase(pObj);
    Mpm_ObjForEachCutSafe( p, pObj, hCut, pCut, hNext )
    {
        if ( Abc_Lit2Var(pCut->pLeaves[0]) == Mig_ObjId(pObj) )
            continue;
        ArrTime = Mpm_CutGetArrTime( p, pCut );
        if ( ArrTime > ReqTime )
            continue;
        pCut->fCompl ^= fCompl;
        pCut = Mpm_ManMergeCuts( p, pCut, NULL, NULL );
        Mpm_ObjAddCutToStore( p, pCut, ArrTime );
    }
}